

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urandom.cc
# Opt level: O2

int CRYPTO_sysrand_if_available(uint8_t *out,size_t requested)

{
  int iVar1;
  int *piVar2;
  int in_ECX;
  
  iVar1 = fill_with_entropy(out,requested,0,in_ECX);
  if (iVar1 == 0) {
    piVar2 = __errno_location();
    if (*piVar2 != 0xb) {
      perror("opportunistic entropy fill failed");
      abort();
    }
    iVar1 = 0;
    if (requested != 0) {
      memset(out,0,requested);
      iVar1 = 0;
    }
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int CRYPTO_sysrand_if_available(uint8_t *out, size_t requested) {
  if (fill_with_entropy(out, requested, /*block=*/0, /*seed=*/0)) {
    return 1;
  } else if (errno == EAGAIN) {
    OPENSSL_memset(out, 0, requested);
    return 0;
  } else {
    perror("opportunistic entropy fill failed");
    abort();
  }
}